

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::TextureFilterMinmaxSupportTestCase::iterate(TextureFilterMinmaxSupportTestCase *this)

{
  SupportedTextureType *pSVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  pointer ppSVar3;
  TestError *this_00;
  pointer pSVar4;
  GLint params;
  pointer local_38;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ppSVar3 = (this->m_utils).m_supportedTextureTypes.
            super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppSVar3 ==
        (this->m_utils).m_supportedTextureTypes.
        super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    pSVar1 = *ppSVar3;
    local_38 = ppSVar3;
    for (pSVar4 = (this->m_utils).m_supportedTextureDataTypes.
                  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar4 != (this->m_utils).m_supportedTextureDataTypes.
                  super__Vector_base<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar4 = pSVar4 + 1) {
      params = 0;
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x880))
                (pSVar1->m_type,pSVar4->m_format,0x9366,4,&params);
      err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
      glu::checkError(err,"getInternalformativ() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x311);
      if (params == 0) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"GetInternalformativ incorrect value","params",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                   ,0x312);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    ppSVar3 = local_38 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureFilterMinmaxSupportTestCase::iterate()
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	const glw::Functions&	 gl			= renderContext.getFunctions();

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter textureTypeIter =
			 m_utils.getSupportedTextureTypes().begin();
		 textureTypeIter != m_utils.getSupportedTextureTypes().end(); ++textureTypeIter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *textureTypeIter;

		for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter dataTypeIter =
				 m_utils.getSupportedTextureDataTypes().begin();
			 dataTypeIter != m_utils.getSupportedTextureDataTypes().end(); ++dataTypeIter)
		{
			glw::GLint params = 0;
			gl.getInternalformativ(textureType->getType(), dataTypeIter->m_format, GL_TEXTURE_REDUCTION_MODE_ARB,
								   sizeof(glw::GLint), &params);
			GLU_EXPECT_NO_ERROR(gl.getError(), "getInternalformativ() call failed.");
			TCU_CHECK_MSG(params, "GetInternalformativ incorrect value");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}